

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbd.h
# Opt level: O0

void embree::collide2::updatePositions(ClothModel *model,float h)

{
  bool bVar1;
  runtime_error *this;
  blocked_range<unsigned_long> *in_RDI;
  undefined4 in_XMM0_Da;
  task_group_context context;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined1 local_108 [4];
  task_group_context *this_00;
  undefined4 in_stack_ffffffffffffff08;
  blocked_range<unsigned_long> local_b8 [6];
  undefined1 *local_20;
  size_type local_18;
  unsigned_long local_10;
  unsigned_long local_8;
  
  local_10 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::size
                       ((vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *)&in_RDI->my_begin
                       );
  this_00 = (task_group_context *)&stack0xffffffffffffff0c;
  local_20 = local_108;
  local_8 = 0;
  local_18 = 1;
  tbb::detail::d1::task_group_context::task_group_context
            (this_00,(kind_type)((ulong)in_RDI >> 0x20),
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  tbb::detail::d1::blocked_range<unsigned_long>::blocked_range(local_b8,local_8,local_10,local_18);
  tbb::detail::d1::
  parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::collide2::updatePositions(embree::collide2::ClothModel&,float)::__0>(unsigned_long,unsigned_long,unsigned_long,embree::collide2::updatePositions(embree::collide2::ClothModel&,float)::__0_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
            (in_RDI,(anon_class_8_1_898bcfc2 *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff08),
             this_00);
  bVar1 = tbb::detail::d1::task_group_context::is_group_execution_cancelled
                    ((task_group_context *)0x13f463);
  if (!bVar1) {
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)0x13f4f3);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"task cancelled");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void updatePositions (ClothModel & model, float h) {

    parallel_for ((size_t)0, model.x_.size (), [&] (const range<size_t>& r) {
        for (size_t i=r.begin(); i<r.end(); i++) {

            model.x_last_[i].x = model.x_old_[i].x;
            model.x_last_[i].y = model.x_old_[i].y;
            model.x_last_[i].z = model.x_old_[i].z;

            model.x_old_[i].x = model.x_[i].x;
            model.x_old_[i].y = model.x_[i].y;
            model.x_old_[i].z = model.x_[i].z;

            model.v_[i].x += model.a_[i].x * h;
            model.v_[i].y += model.a_[i].y * h;
            model.v_[i].z += model.a_[i].z * h;

            model.x_[i].x += model.v_[i].x * h;
            model.x_[i].y += model.v_[i].y * h;
            model.x_[i].z += model.v_[i].z * h;
        }
    });
}